

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void disableCursor(_GLFWwindow *window)

{
  Window WVar1;
  uchar local_24 [4];
  XIEventMask em;
  
  if (window->rawMouseMotion != 0) {
    em.mask = local_24;
    local_24[0] = '\0';
    local_24[1] = '\0';
    em.deviceid = 1;
    em.mask_len = 3;
    local_24[2] = 2;
    (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&em,1);
  }
  _glfw.x11.disabledCursorWindow = window;
  _glfwGetCursorPosX11(window,&_glfw.x11.restoreCursorPosX,&_glfw.x11.restoreCursorPosY);
  updateCursorImage(window);
  _glfwCenterCursorInContentArea(window);
  WVar1 = (window->x11).handle;
  (*_glfw.x11.xlib.GrabPointer)
            (_glfw.x11.display,WVar1,1,0x4c,1,1,WVar1,_glfw.x11.hiddenCursorHandle,0);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        enableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = window;
    _glfwGetCursorPosX11(window,
                         &_glfw.x11.restoreCursorPosX,
                         &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    _glfwCenterCursorInContentArea(window);
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 _glfw.x11.hiddenCursorHandle,
                 CurrentTime);
}